

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_sq_tl(fe *h,fe_loose *f)

{
  uint64_t *puVar1;
  uint _assert_fe_i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 5) {
      fiat_25519_carry_square(h->v,f->v);
      lVar2 = 0;
      do {
        if (lVar2 == 5) {
          return;
        }
        puVar1 = h->v + lVar2;
        lVar2 = lVar2 + 1;
      } while (*puVar1 < 0x8cccccccccccd);
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xf6,"void fe_sq_tl(fe *, const fe_loose *)");
    }
    puVar1 = f->v + lVar2;
    lVar2 = lVar2 + 1;
  } while (*puVar1 < 0x1a666666666665);
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x1a666666666664UL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xf4,"void fe_sq_tl(fe *, const fe_loose *)");
}

Assistant:

static void fe_sq_tl(fe *h, const fe_loose *f) {
  assert_fe_loose(f->v);
  fiat_25519_carry_square(h->v, f->v);
  assert_fe(h->v);
}